

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sequence_info.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateSequenceInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CreateSequenceInfo *this)

{
  pointer pcVar1;
  char *pcVar2;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"CREATE",6);
  if ((this->super_CreateInfo).on_conflict == REPLACE_ON_CONFLICT) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_190," OR REPLACE",0xb);
  }
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_190," TEMPORARY",10);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," SEQUENCE ",10);
  if ((this->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_190," IF NOT EXISTS ",0xf);
  }
  if ((this->super_CreateInfo).temporary == true) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,anon_var_dwarf_6372561 + 9);
  }
  else {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    pcVar1 = (this->super_CreateInfo).catalog._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar1,
               pcVar1 + (this->super_CreateInfo).catalog._M_string_length);
  }
  ParseInfo::QualifierToString(&local_1c0,&local_1e0,&(this->super_CreateInfo).schema,&this->name);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," INCREMENT BY ",0xe);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," MINVALUE ",10);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," MAXVALUE ",10);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," START ",7);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," ",1);
  pcVar2 = "NO CYCLE";
  if ((ulong)this->cycle != 0) {
    pcVar2 = "CYCLE";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,pcVar2,((ulong)this->cycle ^ 1) * 3 + 5);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,";",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string CreateSequenceInfo::ToString() const {
	std::stringstream ss;
	ss << "CREATE";
	if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
		ss << " OR REPLACE";
	}
	if (temporary) {
		ss << " TEMPORARY";
	}
	ss << " SEQUENCE ";
	if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
		ss << " IF NOT EXISTS ";
	}
	ss << QualifierToString(temporary ? "" : catalog, schema, name);
	ss << " INCREMENT BY " << increment;
	ss << " MINVALUE " << min_value;
	ss << " MAXVALUE " << max_value;
	ss << " START " << start_value;
	ss << " " << (cycle ? "CYCLE" : "NO CYCLE") << ";";
	return ss.str();
}